

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O2

int Abc_NodeMffcSizeStop(Abc_Obj_t *pNode)

{
  uint __line;
  int iVar1;
  int iVar2;
  char *__assertion;
  
  if (pNode->pNtk->ntkType == ABC_NTK_STRASH) {
    if (((ulong)pNode & 1) == 0) {
      if ((*(uint *)&pNode->field_0x14 & 0xf) == 7) {
        if ((pNode->vFanins).nSize == 0) {
          return 0;
        }
        iVar1 = Abc_NodeRefDerefStop(pNode,0);
        iVar2 = Abc_NodeRefDerefStop(pNode,1);
        if (iVar1 == iVar2) {
          if (0 < iVar1) {
            return iVar1;
          }
          __assertion = "nConeSize1 > 0";
          __line = 0x55;
        }
        else {
          __assertion = "nConeSize1 == nConeSize2";
          __line = 0x54;
        }
      }
      else {
        __assertion = "Abc_ObjIsNode( pNode )";
        __line = 0x4f;
      }
    }
    else {
      __assertion = "!Abc_ObjIsComplement( pNode )";
      __line = 0x4e;
    }
  }
  else {
    __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
    __line = 0x4d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcRefs.c"
                ,__line,"int Abc_NodeMffcSizeStop(Abc_Obj_t *)");
}

Assistant:

int Abc_NodeMffcSizeStop( Abc_Obj_t * pNode )
{
    int nConeSize1, nConeSize2;
    assert( Abc_NtkIsStrash(pNode->pNtk) );
    assert( !Abc_ObjIsComplement( pNode ) );
    assert( Abc_ObjIsNode( pNode ) );
    if ( Abc_ObjFaninNum(pNode) == 0 )
        return 0;
    nConeSize1 = Abc_NodeRefDerefStop( pNode, 0 ); // dereference
    nConeSize2 = Abc_NodeRefDerefStop( pNode, 1 ); // reference
    assert( nConeSize1 == nConeSize2 );
    assert( nConeSize1 > 0 );
    return nConeSize1;
}